

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_renderer.cpp
# Opt level: O0

void __thiscall
duckdb_shell::ModeTableRenderer::RenderHeader(ModeTableRenderer *this,ColumnarResult *result)

{
  ShellState *in_RSI;
  ColumnarResult *in_RDI;
  ColumnRenderer *unaff_retaddr;
  idx_t i;
  char *in_stack_ffffffffffffffc8;
  ShellState *in_stack_ffffffffffffffd0;
  char *this_00;
  pointer in_stack_ffffffffffffffd8;
  idx_t in_stack_ffffffffffffffe8;
  sqlite3 *nArg;
  ColumnarResult *result_00;
  
  result_00 = in_RDI;
  ShellState::PrintRowSeparator
            (in_RSI,in_stack_ffffffffffffffe8,(char *)in_RDI,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffffd8);
  ShellState::Print(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  for (nArg = (sqlite3 *)0x0; nArg < in_RSI->db;
      nArg = (sqlite3 *)
             ((long)&(nArg->db).
                     super_unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>._M_t.
                     super___uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_duckdb::DuckDB_*,_std::default_delete<duckdb::DuckDB>_>
             + 1)) {
    ColumnRenderer::RenderAlignedValue(unaff_retaddr,result_00,(idx_t)in_RSI);
    in_stack_ffffffffffffffd8 =
         (in_RDI->data).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if (nArg == (sqlite3 *)&in_RSI->db[-1].field_0xa7) {
      this_00 = " |\n";
    }
    else {
      this_00 = " | ";
    }
    ShellState::Print((ShellState *)this_00,in_stack_ffffffffffffffc8);
  }
  ShellState::PrintRowSeparator
            (in_RSI,(idx_t)nArg,(char *)in_RDI,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void RenderHeader(ColumnarResult &result) override {
		state.PrintRowSeparator(result.column_count, "+", result.column_width);
		state.Print("| ");
		for (idx_t i = 0; i < result.column_count; i++) {
			RenderAlignedValue(result, i);
			state.Print(i == result.column_count - 1 ? " |\n" : " | ");
		}
		state.PrintRowSeparator(result.column_count, "+", result.column_width);
	}